

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O3

void __thiscall
SphericalTriangleArea_RandomSampling_Test::TestBody(SphericalTriangleArea_RandomSampling_Test *this)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  byte bVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  char *message;
  int iVar12;
  long lVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  Float FVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM8 [64];
  float fVar30;
  undefined1 auVar31 [16];
  Hammersley2DIter __begin2;
  Float error;
  AssertionResult gtest_ar;
  aligned_storage_t<sizeof(pbrt::TriangleIntersection),_alignof(pbrt::TriangleIntersection)>
  local_180;
  byte local_170;
  Tuple3<pbrt::Point3,_float> local_168;
  Tuple3<pbrt::Point3,_float> local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  IndexingIterator<pbrt::detail::Hammersley2DIter> local_118;
  Tuple3<pbrt::Vector3,_float> local_110;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [16];
  Tuple3<pbrt::Point3,_float> local_d8;
  Tuple3<pbrt::Point3,_float> local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a0 [12];
  float fStack_94;
  float fStack_90;
  float local_8c;
  Float local_88;
  MediumHandle local_80;
  undefined1 local_78 [16];
  long local_60;
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  
  lVar13 = 0;
  do {
    uVar10 = ((ulong)(lVar13 * 0x7fb5d329728ea185) >> 0x1b ^ lVar13 * 0x7fb5d329728ea185) *
             -0x7e25210b43d22bb3;
    uVar10 = ((uVar10 >> 0x21 ^ uVar10) + 1) * 0x5851f42d4c957f2d + lVar13 * -0x4f5c17a566d501a4 + 1
    ;
    uVar11 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
    bVar8 = (byte)(uVar10 >> 0x3b);
    auVar15 = vcvtusi2ss_avx512f(in_ZMM8._0_16_,uVar11 >> bVar8 | uVar11 << 0x20 - bVar8);
    uVar10 = uVar10 * 0x5851f42d4c957f2d + 1 + lVar13 * 2;
    uVar11 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
    bVar8 = (byte)(uVar10 >> 0x3b);
    auVar15 = vminss_avx(ZEXT416((uint)(auVar15._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    auVar16 = vcvtusi2ss_avx512f(in_ZMM8._0_16_,uVar11 >> bVar8 | uVar11 << 0x20 - bVar8);
    auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    auVar26._8_4_ = 0x3f800000;
    auVar26._0_8_ = 0x3f8000003f800000;
    auVar26._12_4_ = 0x3f800000;
    auVar15 = vfmadd213ss_fma(auVar15,SUB6416(ZEXT464(0xc0000000),0),auVar26);
    auVar19 = vfnmadd213ss_fma(auVar15,auVar15,auVar26);
    local_128._0_4_ = auVar15._0_4_;
    auVar15 = vmaxss_avx(auVar19,ZEXT816(0) << 0x20);
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    fVar20 = auVar16._0_4_ * 6.2831855;
    local_148._0_4_ = fVar20;
    fVar20 = cosf(fVar20);
    local_138 = ZEXT416((uint)(fVar20 * auVar15._0_4_));
    fVar20 = sinf((float)local_148._0_4_);
    uVar10 = uVar10 * 0x5851f42d4c957f2d + 1 + lVar13 * 2;
    auVar15 = vinsertps_avx(local_138,ZEXT416((uint)(fVar20 * auVar15._0_4_)),0x10);
    local_158._0_8_ = vmovlps_avx(auVar15);
    local_158.z = (float)local_128._0_4_;
    uVar1 = uVar10 * 0x5851f42d4c957f2d + 1 + lVar13 * 2;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar10;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar1;
    auVar15 = vpunpcklqdq_avx(auVar17,auVar19);
    uVar10 = uVar1 * 0x5851f42d4c957f2d + 1 + lVar13 * 2;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar10 * 0x5851f42d4c957f2d + 1 + lVar13 * 2;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar10;
    auVar16 = vpunpcklqdq_avx(auVar18,auVar27);
    auVar24._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar16;
    auVar24._16_16_ = ZEXT116(1) * auVar15;
    auVar3 = vpsrlvq_avx2(auVar24,_DAT_00603560);
    auVar4 = vpsrlvq_avx2(auVar24,_DAT_00603540);
    auVar24 = vpsrlq_avx2(auVar24,0x3b);
    auVar15 = vpmovqd_avx512vl(auVar24);
    auVar16 = vpmovqd_avx512vl(auVar4 ^ auVar3);
    auVar15 = vprorvd_avx512vl(auVar16,auVar15);
    auVar16 = vcvtudq2ps_avx512vl(auVar15);
    auVar15._8_4_ = 0x2f800000;
    auVar15._0_8_ = 0x2f8000002f800000;
    auVar15._12_4_ = 0x2f800000;
    local_148 = vmulps_avx512vl(auVar16,auVar15);
    auVar16._8_4_ = 0x3f7fffff;
    auVar16._0_8_ = 0x3f7fffff3f7fffff;
    auVar16._12_4_ = 0x3f7fffff;
    uVar10 = vcmpps_avx512vl(local_148,auVar16,1);
    auVar15 = vshufps_avx(local_148,local_148,0xff);
    local_128._0_2_ = (short)uVar10;
    local_138._0_2_ = (ushort)(uVar10 >> 1) & 0x7f;
    bVar8 = (byte)uVar10 >> 2;
    bVar5 = (byte)uVar10 >> 3;
    auVar16 = vshufpd_avx(local_148,local_148,1);
    auVar28._8_4_ = 0x3f800000;
    auVar28._0_8_ = 0x3f8000003f800000;
    auVar28._12_4_ = 0x3f800000;
    local_e8 = vfmadd132ss_fma(ZEXT416((uint)(bVar5 & 1) * auVar15._0_4_ +
                                       (uint)!(bool)(bVar5 & 1) * 0x3f7fffff),auVar28,
                               ZEXT416(0xc0000000));
    auVar15 = vfnmadd213ss_fma(local_e8,local_e8,auVar28);
    auVar15 = vmaxss_avx(auVar15,ZEXT416(0));
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    fVar20 = (float)((uint)(bVar8 & 1) * (int)(auVar16._0_4_ * 6.2831855) +
                    (uint)!(bool)(bVar8 & 1) * 0x40c90fda);
    local_78 = ZEXT416((uint)fVar20);
    local_60 = lVar13;
    fVar20 = cosf(fVar20);
    local_b8 = ZEXT416((uint)(fVar20 * auVar15._0_4_));
    fVar20 = sinf((float)local_78._0_4_);
    auVar15 = vinsertps_avx(local_b8,ZEXT416((uint)(fVar20 * auVar15._0_4_)),0x10);
    local_168._0_8_ = vmovlps_avx(auVar15);
    local_168.z = (float)local_e8._0_4_;
    auVar15 = vmovshdup_avx(local_148);
    auVar29._8_4_ = 0x3f800000;
    auVar29._0_8_ = 0x3f8000003f800000;
    auVar29._12_4_ = 0x3f800000;
    local_138 = vfmadd132ss_fma(ZEXT416((uint)(local_138[0] & 1) * auVar15._0_4_ +
                                        (uint)!(bool)(local_138[0] & 1) * 0x3f7fffff),auVar29,
                                ZEXT416(0xc0000000));
    auVar15 = vfnmadd213ss_fma(local_138,local_138,auVar29);
    auVar15 = vmaxss_avx(auVar15,ZEXT416(0));
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    fVar20 = (float)((uint)(local_128[0] & 1) * (int)(local_148._0_4_ * 6.2831855) +
                    (uint)!(bool)(local_128[0] & 1) * 0x40c90fda);
    local_148 = ZEXT416((uint)fVar20);
    fVar20 = cosf(fVar20);
    local_128 = ZEXT416((uint)(fVar20 * auVar15._0_4_));
    fVar21 = sinf((float)local_148._0_4_);
    fVar21 = fVar21 * auVar15._0_4_;
    in_ZMM8 = ZEXT464((uint)local_168.z);
    auVar17 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
    auVar15 = vinsertps_avx(local_128,ZEXT416((uint)fVar21),0x10);
    local_110._0_8_ = vmovlps_avx(auVar15);
    local_ec = local_158.y + local_168.y + fVar21;
    local_110.z = local_138._0_4_;
    fVar20 = local_110.z + local_168.z + local_158.z;
    local_100 = local_128._0_4_ + local_158.x + local_168.x;
    auVar31._8_4_ = 0x80000000;
    auVar31._0_8_ = 0x8000000080000000;
    auVar31._12_4_ = 0x80000000;
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(local_ec * local_ec)),ZEXT416((uint)local_100),
                              ZEXT416((uint)local_100));
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    fVar30 = auVar15._0_4_;
    local_ec = local_ec / fVar30;
    local_48 = ZEXT416((uint)(fVar20 / fVar30));
    local_100 = local_100 / fVar30;
    auVar16 = ZEXT416((uint)local_100);
    auVar15 = vmovdqa64_avx512vl(auVar17);
    auVar18 = vpternlogd_avx512vl(auVar15,local_48,auVar31,0xf8);
    local_78._0_4_ = local_100;
    fVar14 = auVar18._0_4_;
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(local_ec * local_158.y)),auVar16,
                              ZEXT416((uint)local_158.x));
    auVar19 = vfmadd231ss_avx512f(ZEXT416((uint)(local_ec * fVar21)),auVar16,local_128);
    fVar20 = -1.0 / (fVar20 / fVar30 + fVar14);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_ec * local_168.y)),auVar16,
                              ZEXT416((uint)local_168.x));
    auVar15 = vfmadd231ss_fma(auVar15,local_48,ZEXT416((uint)local_158.z));
    auVar19 = vfmadd231ss_fma(auVar19,local_48,local_138);
    auVar16 = vfmadd231ss_fma(auVar16,local_48,ZEXT416((uint)local_168.z));
    auVar15 = vminss_avx(auVar16,auVar15);
    auVar16 = vfmadd213ss_avx512f(ZEXT416((uint)(local_100 * local_100 * fVar14)),
                                  ZEXT416((uint)fVar20),auVar17);
    auVar15 = vminss_avx(auVar19,auVar15);
    local_b8._0_4_ = auVar15._0_4_;
    local_f8 = local_100 * local_ec * fVar20;
    local_f0 = auVar16._0_4_;
    local_fc = fVar14 * local_f8;
    auVar15 = vfmadd213ss_fma(ZEXT416((uint)(local_ec * local_ec)),ZEXT416((uint)fVar20),auVar18);
    local_100 = local_100 * -fVar14;
    local_f4 = auVar15._0_4_;
    FVar22 = pbrt::SphericalTriangleArea
                       ((Vector3f *)&local_158,(Vector3f *)&local_168,(Vector3f *)&local_110);
    iVar12 = 0;
    local_128._0_4_ = FVar22;
    local_118.i = 0;
    local_118.n = 40000;
    do {
      auVar25._0_8_ = pbrt::detail::Hammersley2DIter::operator*((Hammersley2DIter *)&local_118);
      auVar25._8_56_ = extraout_var;
      auVar16 = auVar25._0_16_;
      auVar15 = vmovshdup_avx(auVar16);
      fVar20 = auVar15._0_4_;
      if ((float)local_128._0_4_ <= 3.1415927) {
        auVar15 = vfmadd231ss_fma(ZEXT416((uint)(1.0 - auVar25._0_4_)),auVar16,
                                  ZEXT416((uint)local_b8._0_4_));
        local_138._0_4_ = auVar15._0_4_;
        auVar15 = vfnmadd213ss_fma(auVar15,auVar15,SUB6416(ZEXT464(0x3f800000),0));
        auVar15 = vmaxss_avx(auVar15,ZEXT416(0));
        fVar20 = (fVar20 + fVar20) * 3.1415927;
        local_e8._0_4_ = fVar20;
        auVar15 = vsqrtss_avx(auVar15,auVar15);
        auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15);
        fVar20 = cosf(fVar20);
        local_148._0_4_ = fVar20 * auVar15._0_4_;
        fVar21 = sinf((float)local_e8._0_4_);
        fVar21 = fVar21 * auVar15._0_4_;
        auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_138._0_4_));
        uVar2 = vcmpss_avx512f(ZEXT416((uint)local_138._0_4_),SUB6416(ZEXT464(0xbf800000),0),1);
        bVar7 = (bool)((byte)uVar2 & 1);
        fVar14 = (float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar15._0_4_);
        auVar15 = ZEXT416((uint)(fVar14 * (float)local_78._0_4_ +
                                (float)local_148._0_4_ * local_f0 + fVar21 * local_f8));
        fVar20 = local_ec * fVar14 + (float)local_148._0_4_ * local_fc + fVar21 * local_f4;
        local_8c = fVar14 * (float)local_48._0_4_ +
                   ((float)local_148._0_4_ * local_100 - local_ec * fVar21);
      }
      else {
        auVar15 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar16,ZEXT416(0xc0000000));
        local_138._0_4_ = auVar15._0_4_;
        auVar15 = vfnmadd213ss_fma(auVar15,auVar15,SUB6416(ZEXT464(0x3f800000),0));
        auVar15 = vmaxss_avx(auVar15,ZEXT416(0));
        auVar15 = vsqrtss_avx(auVar15,auVar15);
        local_148._0_4_ = fVar20 * 6.2831855;
        fVar20 = cosf(fVar20 * 6.2831855);
        local_e8 = ZEXT416((uint)(fVar20 * auVar15._0_4_));
        fVar20 = sinf((float)local_148._0_4_);
        fVar20 = fVar20 * auVar15._0_4_;
        local_8c = (float)local_138._0_4_;
        auVar15 = local_e8;
      }
      auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)fVar20),0x10);
      local_a0._0_4_ = 0.0;
      local_a0._4_4_ = 0.0;
      local_a0._8_4_ = 0.0;
      uVar2 = vmovlps_avx(auVar15);
      fStack_94 = (float)uVar2;
      fStack_90 = (float)((ulong)uVar2 >> 0x20);
      local_88 = 0.0;
      local_80.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      local_c8.x = local_158.x;
      local_c8.y = local_158.y;
      local_d8.x = local_168.x;
      local_d8.y = local_168.y;
      local_c8.z = local_158.z;
      local_58.x = local_110.x;
      local_58.y = local_110.y;
      local_d8.z = local_168.z;
      local_58.z = local_110.z;
      pbrt::IntersectTriangle
                ((optional<pbrt::TriangleIntersection> *)&local_180.__align,(Ray *)local_a0,INFINITY
                 ,(Point3f *)&local_c8,(Point3f *)&local_d8,(Point3f *)&local_58);
      uVar11 = (uint)local_170;
      if (uVar11 == 1) {
        local_170 = 0;
      }
      iVar12 = iVar12 + uVar11;
      iVar9 = local_118.i + 1;
      local_118.i = iVar9;
    } while (iVar9 != 40000);
    local_180.__align = (anon_struct_4_0_00000001_for___align)0x3d0f5c29;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)local_128._0_4_),ZEXT416(0x40490fdb),0xe);
    bVar7 = (bool)((byte)uVar2 & 1);
    fVar20 = (float)iVar12 /
             (float)((uint)bVar7 * 0x4546f194 +
                    (uint)!bVar7 *
                    (int)((1.0 / ((1.0 - (float)local_b8._0_4_) * 6.2831855)) * 40000.0));
    auVar23._0_4_ = (fVar20 - (float)local_128._0_4_) / (float)local_128._0_4_;
    auVar23._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar15 = vandps_avx512vl(auVar23,auVar6);
    local_d8.x = auVar15._0_4_;
    testing::internal::CmpHelperLT<float,float>
              ((internal *)local_a0,"error","0.035f",&local_d8.x,(float *)&local_180.__align);
    lVar13 = local_60;
    if (local_a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_180.__align);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_180._4_4_,local_180.__align) + 0x10),"Area ",5);
      std::ostream::_M_insert<double>((double)(float)local_128._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_180._4_4_,local_180.__align) + 0x10),", estimate ",0xb);
      std::ostream::_M_insert<double>((double)fVar20);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_180._4_4_,local_180.__align) + 0x10),", va = ",7);
      pbrt::operator<<((ostream *)(CONCAT44(local_180._4_4_,local_180.__align) + 0x10),
                       (Vector3<float> *)&local_158);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_180._4_4_,local_180.__align) + 0x10),", vb = ",7);
      pbrt::operator<<((ostream *)(CONCAT44(local_180._4_4_,local_180.__align) + 0x10),
                       (Vector3<float> *)&local_168);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(CONCAT44(local_180._4_4_,local_180.__align) + 0x10),", vc = ",7);
      pbrt::operator<<((ostream *)(CONCAT44(local_180._4_4_,local_180.__align) + 0x10),
                       (Vector3<float> *)&local_110);
      message = "";
      if ((undefined8 *)CONCAT44(fStack_94,local_a0._8_4_) != (undefined8 *)0x0) {
        message = *(char **)CONCAT44(fStack_94,local_a0._8_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                 ,0x227,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_c8,(Message *)&local_180.__align);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
      if (CONCAT44(local_180._4_4_,local_180.__align) != 0) {
        bVar7 = testing::internal::IsTrue(true);
        if ((bVar7) && ((long *)CONCAT44(local_180._4_4_,local_180.__align) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_180._4_4_,local_180.__align) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_a0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    lVar13 = lVar13 + 1;
  } while (lVar13 != 100);
  return;
}

Assistant:

TEST(SphericalTriangleArea, RandomSampling) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Vector3f a = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f b = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Vector3f c = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});

        Vector3f axis = Normalize(a + b + c);
        Frame frame = Frame::FromZ(axis);
        Float cosTheta = std::min({Dot(a, axis), Dot(b, axis), Dot(c, axis)});

        Float area = SphericalTriangleArea(a, b, c);
        bool sampleSphere = area > Pi;
        int sqrtN = 200;
        int count = 0;
        for (Point2f u : Hammersley2D(sqrtN * sqrtN)) {
            Vector3f v;
            if (sampleSphere)
                v = SampleUniformSphere(u);
            else {
                v = SampleUniformCone(u, cosTheta);
                v = frame.FromLocal(v);
            }

            if (IntersectTriangle(Ray(Point3f(0, 0, 0), v), Infinity, Point3f(a),
                                  Point3f(b), Point3f(c)))
                ++count;
        }

        Float pdf = sampleSphere ? UniformSpherePDF() : UniformConePDF(cosTheta);
        Float estA = Float(count) / (sqrtN * sqrtN * pdf);

        Float error = std::abs((estA - area) / area);
        EXPECT_LT(error, 0.035f) << "Area " << area << ", estimate " << estA
                                 << ", va = " << a << ", vb = " << b << ", vc = " << c;
    }
}